

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

MethodPrototypeSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::MethodPrototypeSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::SubroutineKind&,slang::ast::Visibility,slang::ast::MethodFlags>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          SubroutineKind *args_3,Visibility *args_4,MethodFlags *args_5)

{
  string_view name;
  MethodPrototypeSymbol *pMVar1;
  char *in_RCX;
  undefined8 *in_RDX;
  Visibility in_ESI;
  size_t in_R8;
  SourceLocation in_R9;
  MethodFlags *in_stack_00000008;
  size_t in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  BumpAllocator *in_stack_ffffffffffffffa8;
  SubroutineKind in_stack_ffffffffffffffb4;
  Compilation *compilation;
  MethodPrototypeSymbol *this_00;
  bitmask<slang::ast::MethodFlags> flags;
  
  pMVar1 = (MethodPrototypeSymbol *)
           allocate(in_stack_ffffffffffffffa8,
                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff98);
  this_00 = (MethodPrototypeSymbol *)*in_RDX;
  flags.m_bits = (underlying_type)((ulong)in_RDX[1] >> 0x30);
  compilation = *(Compilation **)in_RCX;
  bitmask<slang::ast::MethodFlags>::bitmask
            ((bitmask<slang::ast::MethodFlags> *)&stack0xffffffffffffffb6,*in_stack_00000008);
  name._M_str = in_RCX;
  name._M_len = in_R8;
  ast::MethodPrototypeSymbol::MethodPrototypeSymbol
            (this_00,compilation,name,in_R9,in_stack_ffffffffffffffb4,in_ESI,flags);
  return pMVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }